

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  undefined4 uVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  undefined1 auVar10 [32];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  byte bVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined4 uVar27;
  float *vertices;
  undefined1 (*pauVar28) [16];
  RayHitK<4> *pRVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  undefined1 (*pauVar35) [16];
  long lVar36;
  ulong uVar37;
  undefined1 (*pauVar38) [16];
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  Scene *pSVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  AABBNodeMB4D *node1;
  ulong uVar47;
  ulong uVar48;
  Geometry *pGVar49;
  ulong uVar50;
  ulong uVar51;
  undefined1 (*pauVar52) [16];
  ulong uVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [64];
  undefined1 auVar112 [32];
  undefined1 auVar113 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [64];
  undefined1 auVar121 [16];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [16];
  undefined1 auVar125 [64];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [64];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [64];
  float fVar132;
  float fVar137;
  undefined1 auVar133 [16];
  float fVar135;
  float fVar136;
  undefined1 auVar134 [64];
  Scene *scene;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  RayHitK<4> local_27e1;
  size_t local_27e0;
  RayHitK<4> *local_27d8;
  undefined1 local_27d0 [16];
  undefined1 local_27c0 [16];
  undefined1 local_27b0 [16];
  Scene *local_2798;
  undefined1 local_2790 [16];
  undefined1 local_2780 [16];
  undefined1 local_2770 [16];
  undefined1 local_2760 [16];
  undefined1 local_2750 [16];
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  undefined1 local_2720 [16];
  undefined1 local_2710 [16];
  undefined1 local_2700 [16];
  undefined1 local_26f0 [16];
  undefined1 local_26e0 [16];
  undefined1 (*local_26c8) [16];
  long local_26c0;
  long local_26b8;
  ulong local_26b0;
  ulong local_26a8;
  undefined1 *local_26a0;
  void *local_2698;
  RTCRayQueryContext *local_2690;
  RayHitK<4> *local_2688;
  undefined1 (*local_2680) [16];
  undefined4 local_2678;
  undefined8 local_2670;
  undefined8 uStack_2668;
  undefined1 local_2660 [32];
  undefined1 local_2640 [16];
  RayHitK<4> *local_2630;
  undefined1 local_2620 [16];
  undefined1 local_2610 [16];
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [2] [16];
  undefined1 local_25a0 [32];
  undefined1 local_2570 [16];
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  undefined4 local_2510;
  undefined4 uStack_250c;
  undefined4 uStack_2508;
  undefined4 uStack_2504;
  undefined1 local_2500 [16];
  uint local_24f0;
  uint uStack_24ec;
  uint uStack_24e8;
  uint uStack_24e4;
  uint local_24e0;
  uint uStack_24dc;
  uint uStack_24d8;
  uint uStack_24d4;
  uint uStack_24d0;
  uint uStack_24cc;
  uint uStack_24c8;
  uint uStack_24c4;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar28 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar27 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_23c0._4_4_ = uVar27;
  local_23c0._0_4_ = uVar27;
  local_23c0._8_4_ = uVar27;
  local_23c0._12_4_ = uVar27;
  local_23c0._16_4_ = uVar27;
  local_23c0._20_4_ = uVar27;
  local_23c0._24_4_ = uVar27;
  local_23c0._28_4_ = uVar27;
  auVar103 = ZEXT3264(local_23c0);
  uVar27 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_23e0._4_4_ = uVar27;
  local_23e0._0_4_ = uVar27;
  local_23e0._8_4_ = uVar27;
  local_23e0._12_4_ = uVar27;
  local_23e0._16_4_ = uVar27;
  local_23e0._20_4_ = uVar27;
  local_23e0._24_4_ = uVar27;
  local_23e0._28_4_ = uVar27;
  auVar111 = ZEXT3264(local_23e0);
  uVar27 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2400._4_4_ = uVar27;
  local_2400._0_4_ = uVar27;
  local_2400._8_4_ = uVar27;
  local_2400._12_4_ = uVar27;
  local_2400._16_4_ = uVar27;
  local_2400._20_4_ = uVar27;
  local_2400._24_4_ = uVar27;
  local_2400._28_4_ = uVar27;
  auVar113 = ZEXT3264(local_2400);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar19 = fVar2 * 0.99999964;
  local_2420._4_4_ = fVar19;
  local_2420._0_4_ = fVar19;
  local_2420._8_4_ = fVar19;
  local_2420._12_4_ = fVar19;
  local_2420._16_4_ = fVar19;
  local_2420._20_4_ = fVar19;
  local_2420._24_4_ = fVar19;
  local_2420._28_4_ = fVar19;
  auVar120 = ZEXT3264(local_2420);
  fVar19 = fVar3 * 0.99999964;
  local_2440._4_4_ = fVar19;
  local_2440._0_4_ = fVar19;
  local_2440._8_4_ = fVar19;
  local_2440._12_4_ = fVar19;
  local_2440._16_4_ = fVar19;
  local_2440._20_4_ = fVar19;
  local_2440._24_4_ = fVar19;
  local_2440._28_4_ = fVar19;
  auVar122 = ZEXT3264(local_2440);
  fVar19 = fVar4 * 0.99999964;
  local_2460._4_4_ = fVar19;
  local_2460._0_4_ = fVar19;
  local_2460._8_4_ = fVar19;
  local_2460._12_4_ = fVar19;
  local_2460._16_4_ = fVar19;
  local_2460._20_4_ = fVar19;
  local_2460._24_4_ = fVar19;
  local_2460._28_4_ = fVar19;
  auVar123 = ZEXT3264(local_2460);
  fVar2 = fVar2 * 1.0000004;
  local_2480._4_4_ = fVar2;
  local_2480._0_4_ = fVar2;
  local_2480._8_4_ = fVar2;
  local_2480._12_4_ = fVar2;
  local_2480._16_4_ = fVar2;
  local_2480._20_4_ = fVar2;
  local_2480._24_4_ = fVar2;
  local_2480._28_4_ = fVar2;
  auVar125 = ZEXT3264(local_2480);
  fVar3 = fVar3 * 1.0000004;
  local_24a0._4_4_ = fVar3;
  local_24a0._0_4_ = fVar3;
  local_24a0._8_4_ = fVar3;
  local_24a0._12_4_ = fVar3;
  local_24a0._16_4_ = fVar3;
  local_24a0._20_4_ = fVar3;
  local_24a0._24_4_ = fVar3;
  local_24a0._28_4_ = fVar3;
  auVar128 = ZEXT3264(local_24a0);
  fVar4 = fVar4 * 1.0000004;
  local_24c0._4_4_ = fVar4;
  local_24c0._0_4_ = fVar4;
  local_24c0._8_4_ = fVar4;
  local_24c0._12_4_ = fVar4;
  local_24c0._16_4_ = fVar4;
  local_24c0._20_4_ = fVar4;
  local_24c0._24_4_ = fVar4;
  local_24c0._28_4_ = fVar4;
  auVar131 = ZEXT3264(local_24c0);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_26a8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_26b0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar53 = local_26a8 ^ 0x20;
  uVar51 = local_26b0 ^ 0x20;
  iVar5 = (tray->tnear).field_0.i[k];
  local_25a0._4_4_ = iVar5;
  local_25a0._0_4_ = iVar5;
  local_25a0._8_4_ = iVar5;
  local_25a0._12_4_ = iVar5;
  local_25a0._16_4_ = iVar5;
  local_25a0._20_4_ = iVar5;
  local_25a0._24_4_ = iVar5;
  local_25a0._28_4_ = iVar5;
  auVar134 = ZEXT3264(local_25a0);
  iVar5 = (tray->tfar).field_0.i[k];
  auVar62 = ZEXT3264(CONCAT428(iVar5,CONCAT424(iVar5,CONCAT420(iVar5,CONCAT416(iVar5,CONCAT412(iVar5
                                                  ,CONCAT48(iVar5,CONCAT44(iVar5,iVar5))))))));
  local_26c8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_27d8 = ray;
  local_27e0 = k;
LAB_005d1834:
  do {
    pauVar52 = pauVar28 + -1;
    pauVar28 = pauVar28 + -1;
    if (*(float *)(*pauVar52 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar37 = *(ulong *)*pauVar28;
      while ((uVar37 & 8) == 0) {
        uVar27 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar72._4_4_ = uVar27;
        auVar72._0_4_ = uVar27;
        auVar72._8_4_ = uVar27;
        auVar72._12_4_ = uVar27;
        auVar72._16_4_ = uVar27;
        auVar72._20_4_ = uVar27;
        auVar72._24_4_ = uVar27;
        auVar72._28_4_ = uVar27;
        uVar47 = uVar37 & 0xfffffffffffffff0;
        auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar47 + 0x100 + uVar44),auVar72,
                                  *(undefined1 (*) [32])(uVar47 + 0x40 + uVar44));
        auVar102 = auVar103._0_32_;
        auVar20 = vsubps_avx(ZEXT1632(auVar63),auVar102);
        auVar21._4_4_ = auVar120._4_4_ * auVar20._4_4_;
        auVar21._0_4_ = auVar120._0_4_ * auVar20._0_4_;
        auVar21._8_4_ = auVar120._8_4_ * auVar20._8_4_;
        auVar21._12_4_ = auVar120._12_4_ * auVar20._12_4_;
        auVar21._16_4_ = auVar120._16_4_ * auVar20._16_4_;
        auVar21._20_4_ = auVar120._20_4_ * auVar20._20_4_;
        auVar21._24_4_ = auVar120._24_4_ * auVar20._24_4_;
        auVar21._28_4_ = auVar20._28_4_;
        auVar20 = vmaxps_avx(auVar134._0_32_,auVar21);
        auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar47 + 0x100 + local_26a8),auVar72,
                                  *(undefined1 (*) [32])(uVar47 + 0x40 + local_26a8));
        auVar110 = auVar111._0_32_;
        auVar21 = vsubps_avx(ZEXT1632(auVar63),auVar110);
        auVar10._4_4_ = auVar122._4_4_ * auVar21._4_4_;
        auVar10._0_4_ = auVar122._0_4_ * auVar21._0_4_;
        auVar10._8_4_ = auVar122._8_4_ * auVar21._8_4_;
        auVar10._12_4_ = auVar122._12_4_ * auVar21._12_4_;
        auVar10._16_4_ = auVar122._16_4_ * auVar21._16_4_;
        auVar10._20_4_ = auVar122._20_4_ * auVar21._20_4_;
        auVar10._24_4_ = auVar122._24_4_ * auVar21._24_4_;
        auVar10._28_4_ = auVar21._28_4_;
        auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar47 + 0x100 + local_26b0),auVar72,
                                  *(undefined1 (*) [32])(uVar47 + 0x40 + local_26b0));
        auVar112 = auVar113._0_32_;
        auVar21 = vsubps_avx(ZEXT1632(auVar63),auVar112);
        auVar23._4_4_ = auVar123._4_4_ * auVar21._4_4_;
        auVar23._0_4_ = auVar123._0_4_ * auVar21._0_4_;
        auVar23._8_4_ = auVar123._8_4_ * auVar21._8_4_;
        auVar23._12_4_ = auVar123._12_4_ * auVar21._12_4_;
        auVar23._16_4_ = auVar123._16_4_ * auVar21._16_4_;
        auVar23._20_4_ = auVar123._20_4_ * auVar21._20_4_;
        auVar23._24_4_ = auVar123._24_4_ * auVar21._24_4_;
        auVar23._28_4_ = auVar21._28_4_;
        auVar21 = vmaxps_avx(auVar10,auVar23);
        local_2660 = vmaxps_avx(auVar20,auVar21);
        auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar47 + 0x100 + (uVar44 ^ 0x20)),auVar72,
                                  *(undefined1 (*) [32])(uVar47 + 0x40 + (uVar44 ^ 0x20)));
        auVar20 = vsubps_avx(ZEXT1632(auVar63),auVar102);
        auVar24._4_4_ = auVar125._4_4_ * auVar20._4_4_;
        auVar24._0_4_ = auVar125._0_4_ * auVar20._0_4_;
        auVar24._8_4_ = auVar125._8_4_ * auVar20._8_4_;
        auVar24._12_4_ = auVar125._12_4_ * auVar20._12_4_;
        auVar24._16_4_ = auVar125._16_4_ * auVar20._16_4_;
        auVar24._20_4_ = auVar125._20_4_ * auVar20._20_4_;
        auVar24._24_4_ = auVar125._24_4_ * auVar20._24_4_;
        auVar24._28_4_ = auVar20._28_4_;
        auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar47 + 0x100 + uVar53),auVar72,
                                  *(undefined1 (*) [32])(uVar47 + 0x40 + uVar53));
        auVar20 = vsubps_avx(ZEXT1632(auVar63),auVar110);
        auVar25._4_4_ = auVar128._4_4_ * auVar20._4_4_;
        auVar25._0_4_ = auVar128._0_4_ * auVar20._0_4_;
        auVar25._8_4_ = auVar128._8_4_ * auVar20._8_4_;
        auVar25._12_4_ = auVar128._12_4_ * auVar20._12_4_;
        auVar25._16_4_ = auVar128._16_4_ * auVar20._16_4_;
        auVar25._20_4_ = auVar128._20_4_ * auVar20._20_4_;
        auVar25._24_4_ = auVar128._24_4_ * auVar20._24_4_;
        auVar25._28_4_ = auVar20._28_4_;
        auVar63 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar47 + 0x100 + uVar51),auVar72,
                                  *(undefined1 (*) [32])(uVar47 + 0x40 + uVar51));
        auVar20 = vsubps_avx(ZEXT1632(auVar63),auVar112);
        auVar26._4_4_ = auVar131._4_4_ * auVar20._4_4_;
        auVar26._0_4_ = auVar131._0_4_ * auVar20._0_4_;
        auVar26._8_4_ = auVar131._8_4_ * auVar20._8_4_;
        auVar26._12_4_ = auVar131._12_4_ * auVar20._12_4_;
        auVar26._16_4_ = auVar131._16_4_ * auVar20._16_4_;
        auVar26._20_4_ = auVar131._20_4_ * auVar20._20_4_;
        auVar26._24_4_ = auVar131._24_4_ * auVar20._24_4_;
        auVar26._28_4_ = auVar20._28_4_;
        auVar20 = vminps_avx(auVar25,auVar26);
        auVar21 = vminps_avx(auVar62._0_32_,auVar24);
        auVar20 = vminps_avx(auVar21,auVar20);
        auVar20 = vcmpps_avx(local_2660,auVar20,2);
        if (((uint)uVar37 & 7) == 6) {
          auVar21 = vcmpps_avx(*(undefined1 (*) [32])(uVar47 + 0x1c0),auVar72,2);
          auVar10 = vcmpps_avx(auVar72,*(undefined1 (*) [32])(uVar47 + 0x1e0),1);
          auVar21 = vandps_avx(auVar21,auVar10);
          auVar20 = vandps_avx(auVar21,auVar20);
          auVar63 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
        }
        else {
          auVar63 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
        }
        auVar63 = vpsllw_avx(auVar63,0xf);
        if ((((((((auVar63 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar63 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar63 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar63 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar63 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar63 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar63 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar63[0xf]
           ) {
          if (pauVar28 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_005d1834;
        }
        auVar63 = vpacksswb_avx(auVar63,auVar63);
        bVar22 = SUB161(auVar63 >> 7,0) & 1 | (SUB161(auVar63 >> 0xf,0) & 1) << 1 |
                 (SUB161(auVar63 >> 0x17,0) & 1) << 2 | (SUB161(auVar63 >> 0x1f,0) & 1) << 3 |
                 (SUB161(auVar63 >> 0x27,0) & 1) << 4 | (SUB161(auVar63 >> 0x2f,0) & 1) << 5 |
                 (SUB161(auVar63 >> 0x37,0) & 1) << 6 | SUB161(auVar63 >> 0x3f,0) << 7;
        lVar30 = 0;
        for (uVar37 = (ulong)bVar22; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
          lVar30 = lVar30 + 1;
        }
        uVar37 = *(ulong *)(uVar47 + lVar30 * 8);
        uVar33 = bVar22 - 1 & (uint)bVar22;
        uVar34 = (ulong)uVar33;
        if (uVar33 != 0) {
          uVar7 = *(uint *)(local_2660 + lVar30 * 4);
          lVar30 = 0;
          for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
            lVar30 = lVar30 + 1;
          }
          uVar33 = uVar33 - 1 & uVar33;
          uVar32 = (ulong)uVar33;
          uVar34 = *(ulong *)(uVar47 + lVar30 * 8);
          uVar8 = *(uint *)(local_2660 + lVar30 * 4);
          if (uVar33 == 0) {
            if (uVar7 < uVar8) {
              *(ulong *)*pauVar28 = uVar34;
              *(uint *)(*pauVar28 + 8) = uVar8;
              pauVar28 = pauVar28 + 1;
            }
            else {
              *(ulong *)*pauVar28 = uVar37;
              *(uint *)(*pauVar28 + 8) = uVar7;
              pauVar28 = pauVar28 + 1;
              uVar37 = uVar34;
            }
          }
          else {
            auVar63._8_8_ = 0;
            auVar63._0_8_ = uVar37;
            auVar63 = vpunpcklqdq_avx(auVar63,ZEXT416(uVar7));
            auVar73._8_8_ = 0;
            auVar73._0_8_ = uVar34;
            auVar73 = vpunpcklqdq_avx(auVar73,ZEXT416(uVar8));
            lVar30 = 0;
            for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
              lVar30 = lVar30 + 1;
            }
            uVar33 = uVar33 - 1 & uVar33;
            uVar37 = (ulong)uVar33;
            auVar77._8_8_ = 0;
            auVar77._0_8_ = *(ulong *)(uVar47 + lVar30 * 8);
            auVar64 = vpunpcklqdq_avx(auVar77,ZEXT416(*(uint *)(local_2660 + lVar30 * 4)));
            auVar77 = vpcmpgtd_avx(auVar73,auVar63);
            if (uVar33 == 0) {
              auVar89 = vpshufd_avx(auVar77,0xaa);
              auVar77 = vblendvps_avx(auVar73,auVar63,auVar89);
              auVar63 = vblendvps_avx(auVar63,auVar73,auVar89);
              auVar73 = vpcmpgtd_avx(auVar64,auVar77);
              auVar89 = vpshufd_avx(auVar73,0xaa);
              auVar73 = vblendvps_avx(auVar64,auVar77,auVar89);
              auVar77 = vblendvps_avx(auVar77,auVar64,auVar89);
              auVar64 = vpcmpgtd_avx(auVar77,auVar63);
              auVar89 = vpshufd_avx(auVar64,0xaa);
              auVar64 = vblendvps_avx(auVar77,auVar63,auVar89);
              auVar63 = vblendvps_avx(auVar63,auVar77,auVar89);
              *pauVar28 = auVar63;
              pauVar28[1] = auVar64;
              uVar37 = auVar73._0_8_;
              pauVar28 = pauVar28 + 2;
            }
            else {
              lVar30 = 0;
              for (; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
                lVar30 = lVar30 + 1;
              }
              uVar33 = uVar33 - 1 & uVar33;
              uVar34 = (ulong)uVar33;
              auVar89._8_8_ = 0;
              auVar89._0_8_ = *(ulong *)(uVar47 + lVar30 * 8);
              auVar89 = vpunpcklqdq_avx(auVar89,ZEXT416(*(uint *)(local_2660 + lVar30 * 4)));
              if (uVar33 == 0) {
                auVar67 = vpshufd_avx(auVar77,0xaa);
                auVar77 = vblendvps_avx(auVar73,auVar63,auVar67);
                auVar63 = vblendvps_avx(auVar63,auVar73,auVar67);
                auVar73 = vpcmpgtd_avx(auVar89,auVar64);
                auVar67 = vpshufd_avx(auVar73,0xaa);
                auVar73 = vblendvps_avx(auVar89,auVar64,auVar67);
                auVar64 = vblendvps_avx(auVar64,auVar89,auVar67);
                auVar89 = vpcmpgtd_avx(auVar64,auVar63);
                auVar67 = vpshufd_avx(auVar89,0xaa);
                auVar89 = vblendvps_avx(auVar64,auVar63,auVar67);
                auVar63 = vblendvps_avx(auVar63,auVar64,auVar67);
                auVar64 = vpcmpgtd_avx(auVar73,auVar77);
                auVar67 = vpshufd_avx(auVar64,0xaa);
                auVar64 = vblendvps_avx(auVar73,auVar77,auVar67);
                auVar73 = vblendvps_avx(auVar77,auVar73,auVar67);
                auVar77 = vpcmpgtd_avx(auVar89,auVar73);
                auVar67 = vpshufd_avx(auVar77,0xaa);
                auVar77 = vblendvps_avx(auVar89,auVar73,auVar67);
                auVar73 = vblendvps_avx(auVar73,auVar89,auVar67);
                *pauVar28 = auVar63;
                pauVar28[1] = auVar73;
                pauVar28[2] = auVar77;
                uVar37 = auVar64._0_8_;
                pauVar52 = pauVar28 + 3;
              }
              else {
                *pauVar28 = auVar63;
                pauVar28[1] = auVar73;
                pauVar28[2] = auVar64;
                pauVar28[3] = auVar89;
                lVar30 = 0x30;
                do {
                  lVar31 = lVar30;
                  lVar30 = 0;
                  for (uVar37 = uVar34; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000
                      ) {
                    lVar30 = lVar30 + 1;
                  }
                  uVar37 = *(ulong *)(uVar47 + lVar30 * 8);
                  auVar64._8_8_ = 0;
                  auVar64._0_8_ = uVar37;
                  auVar63 = vpunpcklqdq_avx(auVar64,ZEXT416(*(uint *)(local_2660 + lVar30 * 4)));
                  *(undefined1 (*) [16])(pauVar28[1] + lVar31) = auVar63;
                  uVar34 = uVar34 - 1 & uVar34;
                  lVar30 = lVar31 + 0x10;
                } while (uVar34 != 0);
                pauVar52 = (undefined1 (*) [16])(pauVar28[1] + lVar31);
                if (lVar31 + 0x10 != 0) {
                  lVar30 = 0x10;
                  pauVar35 = pauVar28;
                  do {
                    auVar63 = pauVar35[1];
                    pauVar35 = pauVar35 + 1;
                    uVar33 = vextractps_avx(auVar63,2);
                    lVar31 = lVar30;
                    do {
                      if (uVar33 <= *(uint *)(pauVar28[-1] + lVar31 + 8)) {
                        pauVar38 = (undefined1 (*) [16])(*pauVar28 + lVar31);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar28 + lVar31) =
                           *(undefined1 (*) [16])(pauVar28[-1] + lVar31);
                      lVar31 = lVar31 + -0x10;
                      pauVar38 = pauVar28;
                    } while (lVar31 != 0);
                    *pauVar38 = auVar63;
                    lVar30 = lVar30 + 0x10;
                  } while (pauVar52 != pauVar35);
                  uVar37 = *(ulong *)*pauVar52;
                }
              }
              auVar103 = ZEXT3264(auVar102);
              auVar111 = ZEXT3264(auVar110);
              auVar113 = ZEXT3264(auVar112);
              auVar120 = ZEXT3264(auVar120._0_32_);
              auVar122 = ZEXT3264(auVar122._0_32_);
              auVar123 = ZEXT3264(auVar123._0_32_);
              auVar125 = ZEXT3264(auVar125._0_32_);
              auVar128 = ZEXT3264(auVar128._0_32_);
              auVar131 = ZEXT3264(auVar131._0_32_);
              auVar134 = ZEXT3264(local_25a0);
              pauVar28 = pauVar52;
              k = local_27e0;
              ray = local_27d8;
            }
          }
        }
      }
      local_26c0 = (ulong)((uint)uVar37 & 0xf) - 8;
      if (local_26c0 != 0) {
        uVar37 = uVar37 & 0xfffffffffffffff0;
        local_26b8 = 0;
        do {
          lVar36 = local_26b8 * 0x50;
          pSVar43 = context->scene;
          pGVar49 = (pSVar43->geometries).items[*(uint *)(uVar37 + 0x30 + lVar36)].ptr;
          fVar2 = (pGVar49->time_range).lower;
          fVar2 = pGVar49->fnumTimeSegments *
                  ((*(float *)(ray + k * 4 + 0x70) - fVar2) / ((pGVar49->time_range).upper - fVar2))
          ;
          auVar63 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
          auVar63 = vminss_avx(auVar63,ZEXT416((uint)(pGVar49->fnumTimeSegments + -1.0)));
          auVar74 = vmaxss_avx(ZEXT816(0),auVar63);
          lVar31 = (long)(int)auVar74._0_4_ * 0x38;
          uVar50 = (ulong)*(uint *)(uVar37 + 4 + lVar36);
          lVar30 = *(long *)(*(long *)&pGVar49[2].numPrimitives + lVar31);
          lVar31 = *(long *)(*(long *)&pGVar49[2].numPrimitives + 0x38 + lVar31);
          auVar63 = *(undefined1 (*) [16])(lVar30 + (ulong)*(uint *)(uVar37 + lVar36) * 4);
          uVar48 = (ulong)*(uint *)(uVar37 + 0x10 + lVar36);
          auVar73 = *(undefined1 (*) [16])(lVar30 + uVar48 * 4);
          uVar39 = (ulong)*(uint *)(uVar37 + 0x20 + lVar36);
          auVar80 = *(undefined1 (*) [16])(lVar30 + uVar39 * 4);
          auVar77 = *(undefined1 (*) [16])(lVar30 + uVar50 * 4);
          uVar40 = (ulong)*(uint *)(uVar37 + 0x14 + lVar36);
          auVar64 = *(undefined1 (*) [16])(lVar30 + uVar40 * 4);
          uVar41 = (ulong)*(uint *)(uVar37 + 0x24 + lVar36);
          auVar83 = *(undefined1 (*) [16])(lVar30 + uVar41 * 4);
          uVar42 = (ulong)*(uint *)(uVar37 + 8 + lVar36);
          auVar89 = *(undefined1 (*) [16])(lVar30 + uVar42 * 4);
          uVar47 = (ulong)*(uint *)(uVar37 + 0x18 + lVar36);
          auVar67 = *(undefined1 (*) [16])(lVar30 + uVar47 * 4);
          uVar45 = (ulong)*(uint *)(uVar37 + 0x28 + lVar36);
          auVar65 = *(undefined1 (*) [16])(lVar30 + uVar45 * 4);
          uVar46 = (ulong)*(uint *)(uVar37 + 0xc + lVar36);
          auVar57 = *(undefined1 (*) [16])(lVar30 + uVar46 * 4);
          uVar34 = (ulong)*(uint *)(uVar37 + 0x1c + lVar36);
          auVar55 = *(undefined1 (*) [16])(lVar30 + uVar34 * 4);
          uVar32 = (ulong)*(uint *)(uVar37 + 0x2c + lVar36);
          auVar54 = *(undefined1 (*) [16])(lVar30 + uVar32 * 4);
          auVar56 = *(undefined1 (*) [16])(lVar31 + (ulong)*(uint *)(uVar37 + lVar36) * 4);
          auVar66 = *(undefined1 (*) [16])(lVar31 + uVar48 * 4);
          fVar2 = fVar2 - auVar74._0_4_;
          auVar74 = vunpcklps_avx(auVar63,auVar89);
          auVar89 = vunpckhps_avx(auVar63,auVar89);
          auVar75 = vunpcklps_avx(auVar77,auVar57);
          auVar77 = vunpckhps_avx(auVar77,auVar57);
          auVar63 = *(undefined1 (*) [16])(lVar31 + uVar50 * 4);
          auVar78 = vunpcklps_avx(auVar89,auVar77);
          auVar79 = vunpcklps_avx(auVar74,auVar75);
          auVar89 = vunpckhps_avx(auVar74,auVar75);
          auVar57 = vunpcklps_avx(auVar73,auVar67);
          auVar77 = vunpckhps_avx(auVar73,auVar67);
          auVar67 = vunpcklps_avx(auVar64,auVar55);
          auVar64 = vunpckhps_avx(auVar64,auVar55);
          auVar73 = *(undefined1 (*) [16])(lVar31 + uVar42 * 4);
          auVar55 = vunpcklps_avx(auVar77,auVar64);
          auVar74 = vunpcklps_avx(auVar57,auVar67);
          auVar64 = vunpckhps_avx(auVar57,auVar67);
          auVar57 = vunpcklps_avx(auVar80,auVar65);
          auVar67 = vunpckhps_avx(auVar80,auVar65);
          auVar75 = vunpcklps_avx(auVar83,auVar54);
          auVar65 = vunpckhps_avx(auVar83,auVar54);
          auVar77 = *(undefined1 (*) [16])(lVar31 + uVar46 * 4);
          auVar54 = vunpcklps_avx(auVar67,auVar65);
          auVar80 = vunpcklps_avx(auVar57,auVar75);
          auVar67 = vunpckhps_avx(auVar57,auVar75);
          auVar65 = vunpcklps_avx(auVar56,auVar73);
          auVar73 = vunpckhps_avx(auVar56,auVar73);
          auVar57 = vunpcklps_avx(auVar63,auVar77);
          auVar77 = vunpckhps_avx(auVar63,auVar77);
          auVar63 = *(undefined1 (*) [16])(lVar31 + uVar47 * 4);
          auVar56 = vunpcklps_avx(auVar73,auVar77);
          auVar75 = vunpcklps_avx(auVar65,auVar57);
          auVar77 = vunpckhps_avx(auVar65,auVar57);
          auVar57 = vunpcklps_avx(auVar66,auVar63);
          auVar65 = vunpckhps_avx(auVar66,auVar63);
          auVar63 = *(undefined1 (*) [16])(lVar31 + uVar40 * 4);
          auVar73 = *(undefined1 (*) [16])(lVar31 + uVar34 * 4);
          auVar66 = vunpcklps_avx(auVar63,auVar73);
          auVar63 = vunpckhps_avx(auVar63,auVar73);
          auVar83 = vunpcklps_avx(auVar65,auVar63);
          auVar82 = vunpcklps_avx(auVar57,auVar66);
          auVar65 = vunpckhps_avx(auVar57,auVar66);
          auVar63 = *(undefined1 (*) [16])(lVar31 + uVar39 * 4);
          auVar73 = *(undefined1 (*) [16])(lVar31 + uVar45 * 4);
          auVar66 = vunpcklps_avx(auVar63,auVar73);
          auVar57 = vunpckhps_avx(auVar63,auVar73);
          auVar63 = *(undefined1 (*) [16])(lVar31 + uVar41 * 4);
          auVar73 = *(undefined1 (*) [16])(lVar31 + uVar32 * 4);
          auVar84 = vunpcklps_avx(auVar63,auVar73);
          auVar63 = vunpckhps_avx(auVar63,auVar73);
          auVar73 = vunpcklps_avx(auVar57,auVar63);
          auVar57 = vunpcklps_avx(auVar66,auVar84);
          auVar63 = vunpckhps_avx(auVar66,auVar84);
          fVar3 = 1.0 - fVar2;
          auVar124._4_4_ = fVar3;
          auVar124._0_4_ = fVar3;
          auVar124._8_4_ = fVar3;
          auVar124._12_4_ = fVar3;
          auVar94._0_4_ = fVar2 * auVar75._0_4_;
          auVar94._4_4_ = fVar2 * auVar75._4_4_;
          auVar94._8_4_ = fVar2 * auVar75._8_4_;
          auVar94._12_4_ = fVar2 * auVar75._12_4_;
          auVar66 = vfmadd231ps_fma(auVar94,auVar124,auVar79);
          auVar114._0_4_ = fVar2 * auVar77._0_4_;
          auVar114._4_4_ = fVar2 * auVar77._4_4_;
          auVar114._8_4_ = fVar2 * auVar77._8_4_;
          auVar114._12_4_ = fVar2 * auVar77._12_4_;
          auVar77 = vfmadd231ps_fma(auVar114,auVar124,auVar89);
          auVar104._0_4_ = fVar2 * auVar56._0_4_;
          auVar104._4_4_ = fVar2 * auVar56._4_4_;
          auVar104._8_4_ = fVar2 * auVar56._8_4_;
          auVar104._12_4_ = fVar2 * auVar56._12_4_;
          auVar89 = vfmadd231ps_fma(auVar104,auVar124,auVar78);
          auVar90._0_4_ = fVar2 * auVar82._0_4_;
          auVar90._4_4_ = fVar2 * auVar82._4_4_;
          auVar90._8_4_ = fVar2 * auVar82._8_4_;
          auVar90._12_4_ = fVar2 * auVar82._12_4_;
          auVar56 = vfmadd231ps_fma(auVar90,auVar124,auVar74);
          auVar82._0_4_ = fVar2 * auVar65._0_4_;
          auVar82._4_4_ = fVar2 * auVar65._4_4_;
          auVar82._8_4_ = fVar2 * auVar65._8_4_;
          auVar82._12_4_ = fVar2 * auVar65._12_4_;
          auVar64 = vfmadd231ps_fma(auVar82,auVar124,auVar64);
          puVar1 = (undefined8 *)(uVar37 + 0x30 + lVar36);
          local_2560 = *puVar1;
          uStack_2558 = puVar1[1];
          puVar1 = (undefined8 *)(uVar37 + 0x40 + lVar36);
          auVar65._0_4_ = fVar2 * auVar83._0_4_;
          auVar65._4_4_ = fVar2 * auVar83._4_4_;
          auVar65._8_4_ = fVar2 * auVar83._8_4_;
          auVar65._12_4_ = fVar2 * auVar83._12_4_;
          auVar65 = vfmadd231ps_fma(auVar65,auVar124,auVar55);
          auVar74._0_4_ = fVar2 * auVar57._0_4_;
          auVar74._4_4_ = fVar2 * auVar57._4_4_;
          auVar74._8_4_ = fVar2 * auVar57._8_4_;
          auVar74._12_4_ = fVar2 * auVar57._12_4_;
          auVar78._0_4_ = fVar2 * auVar63._0_4_;
          auVar78._4_4_ = fVar2 * auVar63._4_4_;
          auVar78._8_4_ = fVar2 * auVar63._8_4_;
          auVar78._12_4_ = fVar2 * auVar63._12_4_;
          auVar121._0_4_ = fVar2 * auVar73._0_4_;
          auVar121._4_4_ = fVar2 * auVar73._4_4_;
          auVar121._8_4_ = fVar2 * auVar73._8_4_;
          auVar121._12_4_ = fVar2 * auVar73._12_4_;
          auVar57 = vfmadd231ps_fma(auVar74,auVar124,auVar80);
          auVar67 = vfmadd231ps_fma(auVar78,auVar124,auVar67);
          auVar55 = vfmadd231ps_fma(auVar121,auVar124,auVar54);
          local_2670 = *puVar1;
          uStack_2668 = puVar1[1];
          uVar27 = *(undefined4 *)(local_27d8 + local_27e0 * 4);
          auVar54._4_4_ = uVar27;
          auVar54._0_4_ = uVar27;
          auVar54._8_4_ = uVar27;
          auVar54._12_4_ = uVar27;
          uVar27 = *(undefined4 *)(local_27d8 + local_27e0 * 4 + 0x10);
          auVar126._4_4_ = uVar27;
          auVar126._0_4_ = uVar27;
          auVar126._8_4_ = uVar27;
          auVar126._12_4_ = uVar27;
          uVar27 = *(undefined4 *)(local_27d8 + local_27e0 * 4 + 0x20);
          auVar129._4_4_ = uVar27;
          auVar129._0_4_ = uVar27;
          auVar129._8_4_ = uVar27;
          auVar129._12_4_ = uVar27;
          local_2770 = vsubps_avx(auVar66,auVar54);
          local_26f0 = vsubps_avx(auVar77,auVar126);
          local_2700 = vsubps_avx(auVar89,auVar129);
          auVar63 = vsubps_avx(auVar56,auVar54);
          auVar73 = vsubps_avx(auVar64,auVar126);
          auVar77 = vsubps_avx(auVar65,auVar129);
          auVar64 = vsubps_avx(auVar57,auVar54);
          auVar89 = vsubps_avx(auVar67,auVar126);
          auVar67 = vsubps_avx(auVar55,auVar129);
          local_2780 = vsubps_avx(auVar64,local_2770);
          local_2710 = vsubps_avx(auVar89,local_26f0);
          local_2790 = vsubps_avx(auVar67,local_2700);
          auVar55._0_4_ = auVar64._0_4_ + local_2770._0_4_;
          auVar55._4_4_ = auVar64._4_4_ + local_2770._4_4_;
          auVar55._8_4_ = auVar64._8_4_ + local_2770._8_4_;
          auVar55._12_4_ = auVar64._12_4_ + local_2770._12_4_;
          auVar79._0_4_ = auVar89._0_4_ + local_26f0._0_4_;
          auVar79._4_4_ = auVar89._4_4_ + local_26f0._4_4_;
          auVar79._8_4_ = auVar89._8_4_ + local_26f0._8_4_;
          auVar79._12_4_ = auVar89._12_4_ + local_26f0._12_4_;
          fVar3 = local_2700._0_4_;
          auVar83._0_4_ = auVar67._0_4_ + fVar3;
          fVar4 = local_2700._4_4_;
          auVar83._4_4_ = auVar67._4_4_ + fVar4;
          fVar19 = local_2700._8_4_;
          auVar83._8_4_ = auVar67._8_4_ + fVar19;
          fVar9 = local_2700._12_4_;
          auVar83._12_4_ = auVar67._12_4_ + fVar9;
          auVar127._0_4_ = local_2790._0_4_ * auVar79._0_4_;
          auVar127._4_4_ = local_2790._4_4_ * auVar79._4_4_;
          auVar127._8_4_ = local_2790._8_4_ * auVar79._8_4_;
          auVar127._12_4_ = local_2790._12_4_ * auVar79._12_4_;
          auVar57 = vfmsub231ps_fma(auVar127,local_2710,auVar83);
          auVar84._0_4_ = local_2780._0_4_ * auVar83._0_4_;
          auVar84._4_4_ = local_2780._4_4_ * auVar83._4_4_;
          auVar84._8_4_ = local_2780._8_4_ * auVar83._8_4_;
          auVar84._12_4_ = local_2780._12_4_ * auVar83._12_4_;
          auVar65 = vfmsub231ps_fma(auVar84,local_2790,auVar55);
          auVar56._0_4_ = local_2710._0_4_ * auVar55._0_4_;
          auVar56._4_4_ = local_2710._4_4_ * auVar55._4_4_;
          auVar56._8_4_ = local_2710._8_4_ * auVar55._8_4_;
          auVar56._12_4_ = local_2710._12_4_ * auVar55._12_4_;
          auVar55 = vfmsub231ps_fma(auVar56,local_2780,auVar79);
          fVar2 = *(float *)(local_27d8 + local_27e0 * 4 + 0x60);
          auVar75._0_4_ = fVar2 * auVar55._0_4_;
          auVar75._4_4_ = fVar2 * auVar55._4_4_;
          auVar75._8_4_ = fVar2 * auVar55._8_4_;
          auVar75._12_4_ = fVar2 * auVar55._12_4_;
          uVar27 = *(undefined4 *)(local_27d8 + local_27e0 * 4 + 0x50);
          auVar115._4_4_ = uVar27;
          auVar115._0_4_ = uVar27;
          auVar115._8_4_ = uVar27;
          auVar115._12_4_ = uVar27;
          auVar65 = vfmadd231ps_fma(auVar75,auVar115,auVar65);
          uVar27 = *(undefined4 *)(local_27d8 + local_27e0 * 4 + 0x40);
          auVar130._4_4_ = uVar27;
          auVar130._0_4_ = uVar27;
          auVar130._8_4_ = uVar27;
          auVar130._12_4_ = uVar27;
          local_2750 = vfmadd231ps_fma(auVar65,auVar130,auVar57);
          local_2720 = vsubps_avx(local_26f0,auVar73);
          local_2740 = vsubps_avx(local_2700,auVar77);
          auVar80._0_4_ = local_26f0._0_4_ + auVar73._0_4_;
          auVar80._4_4_ = local_26f0._4_4_ + auVar73._4_4_;
          auVar80._8_4_ = local_26f0._8_4_ + auVar73._8_4_;
          auVar80._12_4_ = local_26f0._12_4_ + auVar73._12_4_;
          auVar85._0_4_ = auVar77._0_4_ + fVar3;
          auVar85._4_4_ = auVar77._4_4_ + fVar4;
          auVar85._8_4_ = auVar77._8_4_ + fVar19;
          auVar85._12_4_ = auVar77._12_4_ + fVar9;
          fVar11 = local_2740._0_4_;
          auVar95._0_4_ = auVar80._0_4_ * fVar11;
          fVar13 = local_2740._4_4_;
          auVar95._4_4_ = auVar80._4_4_ * fVar13;
          fVar15 = local_2740._8_4_;
          auVar95._8_4_ = auVar80._8_4_ * fVar15;
          fVar17 = local_2740._12_4_;
          auVar95._12_4_ = auVar80._12_4_ * fVar17;
          auVar57 = vfmsub231ps_fma(auVar95,local_2720,auVar85);
          local_2730 = vsubps_avx(local_2770,auVar63);
          fVar132 = local_2730._0_4_;
          auVar105._0_4_ = fVar132 * auVar85._0_4_;
          fVar135 = local_2730._4_4_;
          auVar105._4_4_ = fVar135 * auVar85._4_4_;
          fVar136 = local_2730._8_4_;
          auVar105._8_4_ = fVar136 * auVar85._8_4_;
          fVar137 = local_2730._12_4_;
          auVar105._12_4_ = fVar137 * auVar85._12_4_;
          auVar86._0_4_ = local_2770._0_4_ + auVar63._0_4_;
          auVar86._4_4_ = local_2770._4_4_ + auVar63._4_4_;
          auVar86._8_4_ = local_2770._8_4_ + auVar63._8_4_;
          auVar86._12_4_ = local_2770._12_4_ + auVar63._12_4_;
          auVar65 = vfmsub231ps_fma(auVar105,local_2740,auVar86);
          fVar12 = local_2720._0_4_;
          auVar87._0_4_ = auVar86._0_4_ * fVar12;
          fVar14 = local_2720._4_4_;
          auVar87._4_4_ = auVar86._4_4_ * fVar14;
          fVar16 = local_2720._8_4_;
          auVar87._8_4_ = auVar86._8_4_ * fVar16;
          fVar18 = local_2720._12_4_;
          auVar87._12_4_ = auVar86._12_4_ * fVar18;
          auVar55 = vfmsub231ps_fma(auVar87,local_2730,auVar80);
          auVar88._0_4_ = fVar2 * auVar55._0_4_;
          auVar88._4_4_ = fVar2 * auVar55._4_4_;
          auVar88._8_4_ = fVar2 * auVar55._8_4_;
          auVar88._12_4_ = fVar2 * auVar55._12_4_;
          auVar65 = vfmadd231ps_fma(auVar88,auVar115,auVar65);
          local_2660._16_16_ = vfmadd231ps_fma(auVar65,auVar130,auVar57);
          auVar65 = vsubps_avx(auVar63,auVar64);
          auVar96._0_4_ = auVar64._0_4_ + auVar63._0_4_;
          auVar96._4_4_ = auVar64._4_4_ + auVar63._4_4_;
          auVar96._8_4_ = auVar64._8_4_ + auVar63._8_4_;
          auVar96._12_4_ = auVar64._12_4_ + auVar63._12_4_;
          auVar64 = vsubps_avx(auVar73,auVar89);
          auVar57._0_4_ = auVar73._0_4_ + auVar89._0_4_;
          auVar57._4_4_ = auVar73._4_4_ + auVar89._4_4_;
          auVar57._8_4_ = auVar73._8_4_ + auVar89._8_4_;
          auVar57._12_4_ = auVar73._12_4_ + auVar89._12_4_;
          auVar89 = vsubps_avx(auVar77,auVar67);
          auVar66._0_4_ = auVar77._0_4_ + auVar67._0_4_;
          auVar66._4_4_ = auVar77._4_4_ + auVar67._4_4_;
          auVar66._8_4_ = auVar77._8_4_ + auVar67._8_4_;
          auVar66._12_4_ = auVar77._12_4_ + auVar67._12_4_;
          auVar106._0_4_ = auVar57._0_4_ * auVar89._0_4_;
          auVar106._4_4_ = auVar57._4_4_ * auVar89._4_4_;
          auVar106._8_4_ = auVar57._8_4_ * auVar89._8_4_;
          auVar106._12_4_ = auVar57._12_4_ * auVar89._12_4_;
          auVar73 = vfmsub231ps_fma(auVar106,auVar64,auVar66);
          auVar67._0_4_ = auVar66._0_4_ * auVar65._0_4_;
          auVar67._4_4_ = auVar66._4_4_ * auVar65._4_4_;
          auVar67._8_4_ = auVar66._8_4_ * auVar65._8_4_;
          auVar67._12_4_ = auVar66._12_4_ * auVar65._12_4_;
          auVar63 = vfmsub231ps_fma(auVar67,auVar89,auVar96);
          auVar97._0_4_ = auVar64._0_4_ * auVar96._0_4_;
          auVar97._4_4_ = auVar64._4_4_ * auVar96._4_4_;
          auVar97._8_4_ = auVar64._8_4_ * auVar96._8_4_;
          auVar97._12_4_ = auVar64._12_4_ * auVar96._12_4_;
          auVar77 = vfmsub231ps_fma(auVar97,auVar65,auVar57);
          auVar98._0_4_ = fVar2 * auVar77._0_4_;
          auVar98._4_4_ = fVar2 * auVar77._4_4_;
          auVar98._8_4_ = fVar2 * auVar77._8_4_;
          auVar98._12_4_ = fVar2 * auVar77._12_4_;
          auVar63 = vfmadd231ps_fma(auVar98,auVar115,auVar63);
          auVar77 = vfmadd231ps_fma(auVar63,auVar130,auVar73);
          local_2640._0_4_ = auVar77._0_4_ + local_2750._0_4_ + local_2660._16_4_;
          local_2640._4_4_ = auVar77._4_4_ + local_2750._4_4_ + local_2660._20_4_;
          local_2640._8_4_ = auVar77._8_4_ + local_2750._8_4_ + local_2660._24_4_;
          local_2640._12_4_ = auVar77._12_4_ + local_2750._12_4_ + local_2660._28_4_;
          auVar133._8_4_ = 0x7fffffff;
          auVar133._0_8_ = 0x7fffffff7fffffff;
          auVar133._12_4_ = 0x7fffffff;
          auVar63 = vminps_avx(local_2750,local_2660._16_16_);
          auVar63 = vminps_avx(auVar63,auVar77);
          local_2570 = vandps_avx(local_2640,auVar133);
          auVar116._0_4_ = local_2570._0_4_ * 1.1920929e-07;
          auVar116._4_4_ = local_2570._4_4_ * 1.1920929e-07;
          auVar116._8_4_ = local_2570._8_4_ * 1.1920929e-07;
          auVar116._12_4_ = local_2570._12_4_ * 1.1920929e-07;
          uVar47 = CONCAT44(auVar116._4_4_,auVar116._0_4_);
          auVar107._0_8_ = uVar47 ^ 0x8000000080000000;
          auVar107._8_4_ = -auVar116._8_4_;
          auVar107._12_4_ = -auVar116._12_4_;
          auVar63 = vcmpps_avx(auVar63,auVar107,5);
          auVar73 = vmaxps_avx(local_2750,local_2660._16_16_);
          auVar73 = vmaxps_avx(auVar73,auVar77);
          auVar73 = vcmpps_avx(auVar73,auVar116,2);
          local_27d0 = vorps_avx(auVar63,auVar73);
          k = local_27e0;
          ray = local_27d8;
          if ((((local_27d0 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (local_27d0 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (local_27d0 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              local_27d0[0xf] < '\0') {
            auVar68._0_4_ = fVar12 * local_2790._0_4_;
            auVar68._4_4_ = fVar14 * local_2790._4_4_;
            auVar68._8_4_ = fVar16 * local_2790._8_4_;
            auVar68._12_4_ = fVar18 * local_2790._12_4_;
            auVar99._0_4_ = fVar132 * local_2710._0_4_;
            auVar99._4_4_ = fVar135 * local_2710._4_4_;
            auVar99._8_4_ = fVar136 * local_2710._8_4_;
            auVar99._12_4_ = fVar137 * local_2710._12_4_;
            auVar77 = vfmsub213ps_fma(local_2710,local_2740,auVar68);
            auVar108._0_4_ = auVar64._0_4_ * fVar11;
            auVar108._4_4_ = auVar64._4_4_ * fVar13;
            auVar108._8_4_ = auVar64._8_4_ * fVar15;
            auVar108._12_4_ = auVar64._12_4_ * fVar17;
            auVar117._0_4_ = fVar132 * auVar89._0_4_;
            auVar117._4_4_ = fVar135 * auVar89._4_4_;
            auVar117._8_4_ = fVar136 * auVar89._8_4_;
            auVar117._12_4_ = fVar137 * auVar89._12_4_;
            auVar89 = vfmsub213ps_fma(auVar89,local_2720,auVar108);
            auVar63 = vandps_avx(auVar133,auVar68);
            auVar73 = vandps_avx(auVar133,auVar108);
            auVar63 = vcmpps_avx(auVar63,auVar73,1);
            local_25e0 = vblendvps_avx(auVar89,auVar77,auVar63);
            auVar91._0_4_ = fVar12 * auVar65._0_4_;
            auVar91._4_4_ = fVar14 * auVar65._4_4_;
            auVar91._8_4_ = fVar16 * auVar65._8_4_;
            auVar91._12_4_ = fVar18 * auVar65._12_4_;
            auVar77 = vfmsub213ps_fma(auVar65,local_2740,auVar117);
            auVar109._0_4_ = local_2780._0_4_ * fVar11;
            auVar109._4_4_ = local_2780._4_4_ * fVar13;
            auVar109._8_4_ = local_2780._8_4_ * fVar15;
            auVar109._12_4_ = local_2780._12_4_ * fVar17;
            auVar89 = vfmsub213ps_fma(local_2790,local_2730,auVar109);
            auVar63 = vandps_avx(auVar133,auVar109);
            auVar73 = vandps_avx(auVar117,auVar133);
            auVar63 = vcmpps_avx(auVar63,auVar73,1);
            local_25d0 = vblendvps_avx(auVar77,auVar89,auVar63);
            auVar77 = vfmsub213ps_fma(local_2780,local_2720,auVar99);
            auVar64 = vfmsub213ps_fma(auVar64,local_2730,auVar91);
            auVar63 = vandps_avx(auVar133,auVar99);
            auVar73 = vandps_avx(auVar133,auVar91);
            auVar63 = vcmpps_avx(auVar63,auVar73,1);
            local_25c0[0] = vblendvps_avx(auVar64,auVar77,auVar63);
            auVar92._0_4_ = local_25c0[0]._0_4_ * fVar2;
            auVar92._4_4_ = local_25c0[0]._4_4_ * fVar2;
            auVar92._8_4_ = local_25c0[0]._8_4_ * fVar2;
            auVar92._12_4_ = local_25c0[0]._12_4_ * fVar2;
            auVar63 = vfmadd213ps_fma(auVar115,local_25d0,auVar92);
            auVar63 = vfmadd213ps_fma(auVar130,local_25e0,auVar63);
            auVar93._0_4_ = auVar63._0_4_ + auVar63._0_4_;
            auVar93._4_4_ = auVar63._4_4_ + auVar63._4_4_;
            auVar93._8_4_ = auVar63._8_4_ + auVar63._8_4_;
            auVar93._12_4_ = auVar63._12_4_ + auVar63._12_4_;
            auVar100._0_4_ = local_25c0[0]._0_4_ * fVar3;
            auVar100._4_4_ = local_25c0[0]._4_4_ * fVar4;
            auVar100._8_4_ = local_25c0[0]._8_4_ * fVar19;
            auVar100._12_4_ = local_25c0[0]._12_4_ * fVar9;
            auVar63 = vfmadd213ps_fma(local_26f0,local_25d0,auVar100);
            auVar73 = vfmadd213ps_fma(local_2770,local_25e0,auVar63);
            auVar63 = vrcpps_avx(auVar93);
            auVar118._8_4_ = 0x3f800000;
            auVar118._0_8_ = 0x3f8000003f800000;
            auVar118._12_4_ = 0x3f800000;
            auVar77 = vfnmadd213ps_fma(auVar63,auVar93,auVar118);
            auVar63 = vfmadd132ps_fma(auVar77,auVar63,auVar63);
            local_25f0._0_4_ = auVar63._0_4_ * (auVar73._0_4_ + auVar73._0_4_);
            local_25f0._4_4_ = auVar63._4_4_ * (auVar73._4_4_ + auVar73._4_4_);
            local_25f0._8_4_ = auVar63._8_4_ * (auVar73._8_4_ + auVar73._8_4_);
            local_25f0._12_4_ = auVar63._12_4_ * (auVar73._12_4_ + auVar73._12_4_);
            auVar103 = ZEXT1664(local_25f0);
            uVar27 = *(undefined4 *)(local_27d8 + local_27e0 * 4 + 0x30);
            auVar101._4_4_ = uVar27;
            auVar101._0_4_ = uVar27;
            auVar101._8_4_ = uVar27;
            auVar101._12_4_ = uVar27;
            auVar63 = vcmpps_avx(auVar101,local_25f0,2);
            uVar27 = *(undefined4 *)(local_27d8 + local_27e0 * 4 + 0x80);
            auVar119._4_4_ = uVar27;
            auVar119._0_4_ = uVar27;
            auVar119._8_4_ = uVar27;
            auVar119._12_4_ = uVar27;
            auVar111 = ZEXT1664(auVar119);
            auVar73 = vcmpps_avx(local_25f0,auVar119,2);
            auVar63 = vandps_avx(auVar63,auVar73);
            auVar73 = local_27d0 & auVar63;
            if ((((auVar73 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar73 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar73 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar73[0xf] < '\0') {
              auVar63 = vandps_avx(auVar63,local_27d0);
              auVar73 = vcmpps_avx(auVar93,_DAT_01f7aa10,4);
              auVar77 = auVar73 & auVar63;
              if ((((auVar77 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar77 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar77 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar77[0xf] < '\0') {
                local_2760 = vandps_avx(auVar63,auVar73);
                local_2660._0_16_ = local_2750;
                pRVar29 = &local_27e1;
                local_2630 = pRVar29;
                local_2620 = local_2760;
                auVar63 = vrcpps_avx(local_2640);
                auVar76._8_4_ = 0x3f800000;
                auVar76._0_8_ = 0x3f8000003f800000;
                auVar76._12_4_ = 0x3f800000;
                auVar73 = vfnmadd213ps_fma(local_2640,auVar63,auVar76);
                auVar73 = vfmadd132ps_fma(auVar73,auVar63,auVar63);
                auVar69._8_4_ = 0x219392ef;
                auVar69._0_8_ = 0x219392ef219392ef;
                auVar69._12_4_ = 0x219392ef;
                auVar63 = vcmpps_avx(local_2570,auVar69,5);
                auVar63 = vandps_avx(auVar73,auVar63);
                auVar58._0_4_ = local_2750._0_4_ * auVar63._0_4_;
                auVar58._4_4_ = local_2750._4_4_ * auVar63._4_4_;
                auVar58._8_4_ = local_2750._8_4_ * auVar63._8_4_;
                auVar58._12_4_ = local_2750._12_4_ * auVar63._12_4_;
                local_2610 = vminps_avx(auVar58,auVar76);
                auVar59._0_4_ = auVar63._0_4_ * local_2660._16_4_;
                auVar59._4_4_ = auVar63._4_4_ * local_2660._20_4_;
                auVar59._8_4_ = auVar63._8_4_ * local_2660._24_4_;
                auVar59._12_4_ = auVar63._12_4_ * local_2660._28_4_;
                local_2600 = vminps_avx(auVar59,auVar76);
                auVar70._8_4_ = 0x7f800000;
                auVar70._0_8_ = 0x7f8000007f800000;
                auVar70._12_4_ = 0x7f800000;
                auVar63 = vblendvps_avx(auVar70,local_25f0,local_2760);
                auVar73 = vshufps_avx(auVar63,auVar63,0xb1);
                auVar73 = vminps_avx(auVar73,auVar63);
                auVar77 = vshufpd_avx(auVar73,auVar73,1);
                auVar73 = vminps_avx(auVar77,auVar73);
                auVar63 = vcmpps_avx(auVar63,auVar73,0);
                auVar77 = local_2760 & auVar63;
                auVar73 = vpcmpeqd_avx(auVar73,auVar73);
                if ((((auVar77 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar77 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar77 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar77[0xf] < '\0') {
                  auVar73 = auVar63;
                }
                auVar63 = vandps_avx(local_2760,auVar73);
                local_2798 = pSVar43;
                do {
                  auVar63 = vpslld_avx(auVar63,0x1f);
                  uVar27 = vmovmskps_avx(auVar63);
                  lVar30 = 0;
                  for (uVar47 = CONCAT44((int)((ulong)pRVar29 >> 0x20),uVar27); (uVar47 & 1) == 0;
                      uVar47 = uVar47 >> 1 | 0x8000000000000000) {
                    lVar30 = lVar30 + 1;
                  }
                  local_24f0 = *(uint *)((long)&local_2560 + lVar30 * 4);
                  pRVar29 = (RayHitK<4> *)(ulong)local_24f0;
                  pGVar49 = (pSVar43->geometries).items[(long)pRVar29].ptr;
                  if ((pGVar49->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    *(undefined4 *)(local_2760 + lVar30 * 4) = 0;
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar49->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar47 = (ulong)(uint)((int)lVar30 << 2);
                      uVar27 = *(undefined4 *)(local_2610 + uVar47);
                      uVar6 = *(undefined4 *)(local_2600 + uVar47);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25f0 + uVar47);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_25e0 + uVar47);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_25d0 + uVar47);
                      *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_25c0[0] + uVar47);
                      *(undefined4 *)(ray + k * 4 + 0xf0) = uVar27;
                      *(undefined4 *)(ray + k * 4 + 0x100) = uVar6;
                      *(undefined4 *)(ray + k * 4 + 0x110) =
                           *(undefined4 *)((long)&local_2670 + uVar47);
                      *(uint *)(ray + k * 4 + 0x120) = local_24f0;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      break;
                    }
                    uVar47 = (ulong)(uint)((int)lVar30 * 4);
                    uVar27 = *(undefined4 *)(local_2610 + uVar47);
                    local_2520._4_4_ = uVar27;
                    local_2520._0_4_ = uVar27;
                    local_2520._8_4_ = uVar27;
                    local_2520._12_4_ = uVar27;
                    local_2510 = *(undefined4 *)(local_2600 + uVar47);
                    uVar27 = *(undefined4 *)((long)&local_2670 + uVar47);
                    auVar81._4_4_ = uVar27;
                    auVar81._0_4_ = uVar27;
                    auVar81._8_4_ = uVar27;
                    auVar81._12_4_ = uVar27;
                    uVar27 = *(undefined4 *)(local_25e0 + uVar47);
                    local_2550._4_4_ = uVar27;
                    local_2550._0_4_ = uVar27;
                    local_2550._8_4_ = uVar27;
                    local_2550._12_4_ = uVar27;
                    uVar27 = *(undefined4 *)(local_25d0 + uVar47);
                    local_2540._4_4_ = uVar27;
                    local_2540._0_4_ = uVar27;
                    local_2540._8_4_ = uVar27;
                    local_2540._12_4_ = uVar27;
                    uVar27 = *(undefined4 *)(local_25c0[0] + uVar47);
                    local_2530._4_4_ = uVar27;
                    local_2530._0_4_ = uVar27;
                    local_2530._8_4_ = uVar27;
                    local_2530._12_4_ = uVar27;
                    uStack_250c = local_2510;
                    uStack_2508 = local_2510;
                    uStack_2504 = local_2510;
                    local_2500 = auVar81;
                    uStack_24ec = local_24f0;
                    uStack_24e8 = local_24f0;
                    uStack_24e4 = local_24f0;
                    vpcmpeqd_avx2(ZEXT1632(local_2520),ZEXT1632(local_2520));
                    uStack_24dc = context->user->instID[0];
                    local_24e0 = uStack_24dc;
                    uStack_24d8 = uStack_24dc;
                    uStack_24d4 = uStack_24dc;
                    uStack_24d0 = context->user->instPrimID[0];
                    uStack_24cc = uStack_24d0;
                    uStack_24c8 = uStack_24d0;
                    uStack_24c4 = uStack_24d0;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_25f0 + uVar47);
                    local_26e0 = *local_26c8;
                    local_26a0 = local_26e0;
                    local_2698 = pGVar49->userPtr;
                    local_2690 = context->user;
                    local_2680 = &local_2550;
                    local_2678 = 4;
                    pRVar29 = (RayHitK<4> *)pGVar49->intersectionFilterN;
                    local_27b0 = auVar103._0_16_;
                    local_27c0 = auVar111._0_16_;
                    local_27d0._0_8_ = lVar30;
                    local_2688 = ray;
                    if (pRVar29 != (RayHitK<4> *)0x0) {
                      local_2770._0_8_ = pGVar49;
                      pRVar29 = (RayHitK<4> *)(*(code *)pRVar29)(&local_26a0);
                      auVar111 = ZEXT1664(local_27c0);
                      auVar103 = ZEXT1664(local_27b0);
                      k = local_27e0;
                      pSVar43 = local_2798;
                      lVar30 = local_27d0._0_8_;
                      ray = local_27d8;
                      pGVar49 = (Geometry *)local_2770._0_8_;
                    }
                    if (local_26e0 == (undefined1  [16])0x0) {
                      auVar63 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                      auVar63 = auVar63 ^ _DAT_01f7ae20;
                    }
                    else {
                      pRVar29 = (RayHitK<4> *)context->args->filter;
                      if ((pRVar29 != (RayHitK<4> *)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar49->field_8).field_0x2 & 0x40) != 0)))) {
                        pRVar29 = (RayHitK<4> *)(*(code *)pRVar29)(&local_26a0);
                        auVar111 = ZEXT1664(local_27c0);
                        auVar103 = ZEXT1664(local_27b0);
                        k = local_27e0;
                        pSVar43 = local_2798;
                        lVar30 = local_27d0._0_8_;
                        ray = local_27d8;
                      }
                      auVar73 = vpcmpeqd_avx(local_26e0,_DAT_01f7aa10);
                      auVar77 = vpcmpeqd_avx(auVar81,auVar81);
                      auVar63 = auVar73 ^ auVar77;
                      if (local_26e0 != (undefined1  [16])0x0) {
                        auVar73 = auVar73 ^ auVar77;
                        auVar77 = vmaskmovps_avx(auVar73,*local_2680);
                        *(undefined1 (*) [16])(local_2688 + 0xc0) = auVar77;
                        auVar77 = vmaskmovps_avx(auVar73,local_2680[1]);
                        *(undefined1 (*) [16])(local_2688 + 0xd0) = auVar77;
                        auVar77 = vmaskmovps_avx(auVar73,local_2680[2]);
                        *(undefined1 (*) [16])(local_2688 + 0xe0) = auVar77;
                        auVar77 = vmaskmovps_avx(auVar73,local_2680[3]);
                        *(undefined1 (*) [16])(local_2688 + 0xf0) = auVar77;
                        auVar77 = vmaskmovps_avx(auVar73,local_2680[4]);
                        *(undefined1 (*) [16])(local_2688 + 0x100) = auVar77;
                        auVar77 = vmaskmovps_avx(auVar73,local_2680[5]);
                        *(undefined1 (*) [16])(local_2688 + 0x110) = auVar77;
                        auVar77 = vmaskmovps_avx(auVar73,local_2680[6]);
                        *(undefined1 (*) [16])(local_2688 + 0x120) = auVar77;
                        auVar77 = vmaskmovps_avx(auVar73,local_2680[7]);
                        *(undefined1 (*) [16])(local_2688 + 0x130) = auVar77;
                        auVar73 = vmaskmovps_avx(auVar73,local_2680[8]);
                        *(undefined1 (*) [16])(local_2688 + 0x140) = auVar73;
                        pRVar29 = local_2688;
                      }
                    }
                    auVar60._8_8_ = 0x100000001;
                    auVar60._0_8_ = 0x100000001;
                    if ((auVar60 & auVar63) == (undefined1  [16])0x0) {
                      *(int *)(ray + k * 4 + 0x80) = auVar111._0_4_;
                    }
                    else {
                      auVar111 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                    }
                    *(undefined4 *)(local_2760 + lVar30 * 4) = 0;
                    uVar27 = auVar111._0_4_;
                    auVar61._4_4_ = uVar27;
                    auVar61._0_4_ = uVar27;
                    auVar61._8_4_ = uVar27;
                    auVar61._12_4_ = uVar27;
                    auVar63 = vcmpps_avx(auVar103._0_16_,auVar61,2);
                    local_2760 = vandps_avx(auVar63,local_2760);
                  }
                  if ((((local_2760 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_2760 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_2760 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_2760[0xf]) break;
                  auVar71._8_4_ = 0x7f800000;
                  auVar71._0_8_ = 0x7f8000007f800000;
                  auVar71._12_4_ = 0x7f800000;
                  auVar63 = vblendvps_avx(auVar71,auVar103._0_16_,local_2760);
                  auVar73 = vshufps_avx(auVar63,auVar63,0xb1);
                  auVar73 = vminps_avx(auVar73,auVar63);
                  auVar77 = vshufpd_avx(auVar73,auVar73,1);
                  auVar73 = vminps_avx(auVar77,auVar73);
                  auVar73 = vcmpps_avx(auVar63,auVar73,0);
                  auVar77 = local_2760 & auVar73;
                  auVar63 = local_2760;
                  if ((((auVar77 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar77 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar77 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar77[0xf] < '\0') {
                    auVar63 = vandps_avx(auVar73,local_2760);
                  }
                  auVar63 = vpcmpgtd_avx(ZEXT816(0) << 0x20,auVar63);
                } while( true );
              }
            }
          }
          local_26b8 = local_26b8 + 1;
        } while (local_26b8 != local_26c0);
      }
      uVar27 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar62 = ZEXT3264(CONCAT428(uVar27,CONCAT424(uVar27,CONCAT420(uVar27,CONCAT416(uVar27,
                                                  CONCAT412(uVar27,CONCAT48(uVar27,CONCAT44(uVar27,
                                                  uVar27))))))));
      auVar103 = ZEXT3264(local_23c0);
      auVar111 = ZEXT3264(local_23e0);
      auVar113 = ZEXT3264(local_2400);
      auVar120 = ZEXT3264(local_2420);
      auVar122 = ZEXT3264(local_2440);
      auVar123 = ZEXT3264(local_2460);
      auVar125 = ZEXT3264(local_2480);
      auVar128 = ZEXT3264(local_24a0);
      auVar131 = ZEXT3264(local_24c0);
      auVar134 = ZEXT3264(local_25a0);
    }
    if (pauVar28 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }